

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::MaterialFromAttributes(ONX_Model *this,ON_3dmObjectAttributes *attributes)

{
  object_material_source oVar1;
  ON_3dmObjectAttributes *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ON_ModelComponentReference OVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  oVar1 = ON_3dmObjectAttributes::MaterialSource(in_RDX);
  if ((oVar1 == material_from_parent) || (oVar1 == material_from_object)) {
    OVar3 = MaterialFromIndex(this,(int)attributes);
    _Var2._M_pi = OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else if (oVar1 == material_from_layer) {
    OVar3 = MaterialFromLayerIndex(this,(int)attributes);
    _Var2._M_pi = OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,
               (ON_ModelComponentReference *)&attributes[5].m_group.m_count);
    _Var2._M_pi = extraout_RDX;
  }
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::MaterialFromAttributes(
  const ON_3dmObjectAttributes& attributes
  ) const
{
  switch ( attributes.MaterialSource() )
  {
  case ON::material_from_layer:
    return MaterialFromLayerIndex( attributes.m_layer_index );
    break;

  case ON::material_from_object:
    return MaterialFromIndex( attributes.m_material_index );
    break;

  case ON::material_from_parent:
    // TODO: If object is an idef, get material from iref attributes.
    return MaterialFromIndex( attributes.m_material_index );
    break;
  }

  return m_default_render_material;
}